

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

Token * __thiscall JSON::Parser::readStringToken(Token *__return_storage_ptr__,Parser *this)

{
  string *psVar1;
  byte bVar2;
  undefined8 extraout_RAX;
  long lVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  int iVar7;
  bool bVar8;
  string value;
  long *local_a0 [2];
  long local_90 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  string *local_78;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  char *local_50;
  size_type local_48;
  char local_40;
  undefined7 uStack_3f;
  undefined8 uStack_38;
  
  pcVar6 = &local_40;
  local_50 = pcVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  __return_storage_ptr__->type = STRING;
  local_78 = (string *)&__return_storage_ptr__->value;
  local_80 = &(__return_storage_ptr__->value).field_2;
  (__return_storage_ptr__->value)._M_dataplus._M_p = (pointer)local_80;
  if (local_50 == pcVar6) {
    local_80->_M_allocated_capacity = CONCAT71(uStack_3f,local_40);
    *(undefined8 *)((long)&(__return_storage_ptr__->value).field_2 + 8) = uStack_38;
  }
  else {
    (((string *)local_78)->_M_dataplus)._M_p = local_50;
    local_80->_M_allocated_capacity = CONCAT71(uStack_3f,local_40);
  }
  (__return_storage_ptr__->value)._M_string_length = local_48;
  local_48 = 0;
  local_40 = '\0';
  iVar4 = this->pos;
  __return_storage_ptr__->start = iVar4;
  iVar4 = iVar4 + 1;
  this->pos = iVar4;
  local_68 = 0;
  local_60 = 0;
  iVar7 = this->length;
  local_70 = &local_60;
  local_50 = pcVar6;
  if (iVar4 < iVar7) {
    psVar1 = &this->input;
    bVar8 = false;
    do {
      uVar5 = (uint)pcVar6;
      lVar3 = (long)iVar4;
      while (bVar8) {
        iVar4 = iVar4 + 1;
        this->pos = iVar4;
        lVar3 = lVar3 + 1;
        bVar8 = false;
        if (iVar7 <= iVar4) goto LAB_00106991;
      }
      bVar2 = (psVar1->_M_dataplus)._M_p[lVar3];
      pcVar6 = (char *)(ulong)bVar2;
      uVar5 = (uint)bVar2;
      if (bVar2 == 0x5c) {
        std::__cxx11::string::substr((ulong)local_a0,(ulong)psVar1);
        std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_a0[0]);
        if (local_a0[0] != local_90) {
          operator_delete(local_a0[0],local_90[0] + 1);
        }
        iVar7 = this->length;
        iVar4 = this->pos;
        bVar8 = true;
      }
      else {
        if (bVar2 == 0x22) goto LAB_0010699a;
        bVar8 = false;
      }
      iVar4 = iVar4 + 1;
      this->pos = iVar4;
    } while (iVar4 < iVar7);
LAB_00106991:
    if (uVar5 == 0x22) {
LAB_0010699a:
      std::__cxx11::string::substr((ulong)local_a0,(ulong)psVar1);
      std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_a0[0]);
      if (local_a0[0] != local_90) {
        operator_delete(local_a0[0],local_90[0] + 1);
      }
      this->pos = this->pos + 1;
      std::__cxx11::string::_M_assign(local_78);
      __return_storage_ptr__->end = this->pos;
      if (local_70 != &local_60) {
        operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
      }
      return __return_storage_ptr__;
    }
  }
  unexpected(this,TYPE_STRING,iVar4);
  if (local_a0[0] != local_90) {
    operator_delete(local_a0[0],local_90[0] + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*(long **)local_78 != local_80) {
    operator_delete(*(long **)local_78,local_80->_M_allocated_capacity + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

Token Parser::readStringToken() {
        Token token(STRING, "");
        token.start = pos;
        int chunkStart = ++pos;
        int code;
        string value;
        bool isEscapeChar = false;

        while (isValidPos()) {
            if (isEscapeChar) {
                isEscapeChar = false;
                pos++;
                continue;
            }

            code = getCodeAt(pos);
            if (code == 34) { // '"'
                break;
            }
            if (code == 92) { // '\': escape
                isEscapeChar = true;
                value += input.substr(chunkStart, pos - chunkStart);
                chunkStart = ++pos;
            } else {
                pos++;
            }
        }

        if (code != 34) { // '"'
            unexpected(TYPE_STRING, pos);
        }

        value += input.substr(chunkStart, pos - chunkStart);
        pos++;
        token.value = value;
        token.end = pos;
        return token;
    }